

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqldatabase.cpp
# Opt level: O3

QSqlDatabase __thiscall
QSqlDatabase::cloneDatabase(QSqlDatabase *this,QSqlDatabase *other,QString *connectionName)

{
  QSqlDriver *pQVar1;
  QSqlDatabasePrivate *pQVar2;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  long in_FS_OFFSET;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = other->d->driver;
  if ((pQVar1 == (QSqlDriver *)0x0) ||
     (QSqlDatabasePrivate::shared_null(), pQVar1 == QSqlDatabasePrivate::shared_null::n.driver)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QSqlDatabase(this);
      return (QSqlDatabase)(QSqlDatabasePrivate *)this;
    }
  }
  else {
    this->d = (QSqlDatabasePrivate *)0xaaaaaaaaaaaaaaaa;
    pQVar2 = other->d;
    local_40.d.d = (pQVar2->drvName).d.d;
    local_40.d.ptr = (pQVar2->drvName).d.ptr;
    local_40.d.size = (pQVar2->drvName).d.size;
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_40.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_40.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QSqlDatabase(this,&local_40);
    src = extraout_RDX;
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
        src = extraout_RDX_00;
      }
    }
    QSqlDatabasePrivate::copy(this->d,(EVP_PKEY_CTX *)other->d,src);
    QSqlDatabasePrivate::addDatabase(this,connectionName);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return (QSqlDatabase)(QSqlDatabasePrivate *)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

QSqlDatabase QSqlDatabase::cloneDatabase(const QSqlDatabase &other, const QString &connectionName)
{
    if (!other.isValid())
        return QSqlDatabase();

    QSqlDatabase db(other.driverName());
    db.d->copy(other.d);
    QSqlDatabasePrivate::addDatabase(db, connectionName);
    return db;
}